

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

void Cbs2_ManDeleteFanout_rec(Cbs2_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  int iObj_00;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = (ulong)(uint)iObj;
  while( true ) {
    iObj_00 = (int)uVar3;
    if ((iObj_00 < 0) || (p->pAig->nObjs <= iObj_00)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pAig->pObjs;
    Cbs2_ObjDeleteFanout(p,iObj_00);
    uVar2 = *(undefined8 *)(pGVar1 + uVar3);
    uVar4 = (uint)uVar2;
    if ((~uVar4 & 0x9fffffff) == 0) {
      return;
    }
    if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x5fa,"void Cbs2_ManDeleteFanout_rec(Cbs2_Man_t *, int)");
    }
    uVar4 = iObj_00 - (uVar4 & 0x1fffffff);
    if (((int)uVar4 < 0) || ((p->vFanout0).nSize <= (int)uVar4)) break;
    if ((p->vFanout0).pArray[uVar4] != 0) {
      Cbs2_ManDeleteFanout_rec(p,uVar4);
    }
    uVar4 = iObj_00 - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff);
    uVar3 = (ulong)uVar4;
    if (((int)uVar4 < 0) || ((p->vFanout0).nSize <= (int)uVar4)) break;
    if ((p->vFanout0).pArray[uVar4] == 0) {
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Cbs2_ManDeleteFanout_rec( Cbs2_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pAig, iObj); int iFan0, iFan1;
    Cbs2_ObjDeleteFanout( p, iObj ); 
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    iFan0 = Gia_ObjFaninId0(pObj, iObj);
    iFan1 = Gia_ObjFaninId1(pObj, iObj);
    if ( Vec_IntEntry(&p->vFanout0, iFan0) )  Cbs2_ManDeleteFanout_rec( p, iFan0 );
    if ( Vec_IntEntry(&p->vFanout0, iFan1) )  Cbs2_ManDeleteFanout_rec( p, iFan1 );
}